

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_or_else(t_parser *this,bool a_assignable)

{
  bool bVar1;
  t_token tVar2;
  t_at *ptVar3;
  pointer ptVar4;
  undefined7 in_register_00000031;
  long lVar5;
  bool bVar6;
  undefined1 local_60 [24];
  __single_object branch;
  t_at at;
  bool a_assignable_local;
  t_parser *this_local;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *node;
  
  lVar5 = CONCAT71(in_register_00000031,a_assignable);
  f_and_also(this,a_assignable);
  while( true ) {
    bVar1 = t_lexer::f_newline((t_lexer *)(lVar5 + 8));
    bVar6 = false;
    if (!bVar1) {
      tVar2 = t_lexer::f_token((t_lexer *)(lVar5 + 8));
      bVar6 = tVar2 == c_token__OR_ELSE;
    }
    if (!bVar6) break;
    ptVar3 = t_lexer::f_at((t_lexer *)(lVar5 + 8));
    branch._M_t.super___uniq_ptr_impl<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_>.
    _M_t.super__Tuple_impl<0UL,_xemmai::ast::t_if_*,_std::default_delete<xemmai::ast::t_if>_>.
    super__Head_base<0UL,_xemmai::ast::t_if_*,_false>._M_head_impl =
         (__uniq_ptr_data<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>,_true,_true>)
         ptVar3->v_position;
    t_lexer::f_next((t_lexer *)(lVar5 + 8));
    local_60[0xf] = 1;
    std::
    make_unique<xemmai::ast::t_if,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,bool>
              ((t_at *)(local_60 + 0x10),
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)&branch
               ,(bool *)this);
    ptVar4 = std::unique_ptr<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_>::operator->
                       ((unique_ptr<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_> *)
                        (local_60 + 0x10));
    f_and_also((t_parser *)local_60,a_assignable);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ::push_back(&ptVar4->v_false,(value_type *)local_60);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_60);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::operator=
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_> *)
               (local_60 + 0x10));
    std::unique_ptr<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_if,_std::default_delete<xemmai::ast::t_if>_> *)
               (local_60 + 0x10));
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_or_else(bool a_assignable)
{
	auto node = f_and_also(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__OR_ELSE) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		auto branch = std::make_unique<ast::t_if>(at, std::move(node), true);
		branch->v_false.push_back(f_and_also(false));
		node = std::move(branch);
	}
	return node;
}